

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

double trng::math::detail::mln1p<double>(double x)

{
  int n;
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (0.03125 <= ABS(x)) {
    dVar4 = log1p(x);
    return x - dVar4;
  }
  dVar2 = 0.0;
  dVar3 = 1.0;
  iVar1 = 2;
  dVar4 = x;
  do {
    dVar4 = dVar4 * x;
    dVar5 = (dVar3 * dVar4) / (double)iVar1;
    dVar2 = dVar2 + dVar5;
    if (ABS(dVar5) < dVar2 * 8.881784197001252e-16) {
      return dVar2;
    }
    dVar3 = -dVar3;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 0x35);
  return dVar2;
}

Assistant:

TRNG_CUDA_ENABLE T mln1p(T x) {
        if (abs(x) >= T(1) / T(32))
          return x - ln1p(x);
        // use Taylor expansion for small arguments
        T y{0};
        T x_to_the_n{x * x};
        T sign{1};
        for (int n{2}; n < numeric_limits<T>::digits; ++n) {
          const T delta{sign * x_to_the_n / n};
          y += delta;
          if (abs(delta) < 4 * numeric_limits<T>::epsilon() * y)
            break;
          x_to_the_n *= x;
          sign = -sign;
        }
        return y;
      }